

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

RegexFlags __thiscall
Js::JavascriptRegExp::SetRegexFlag
          (JavascriptRegExp *this,PropertyId propertyId,RegexFlags flags,RegexFlags flag,
          ScriptContext *scriptContext)

{
  bool bVar1;
  Var aValue;
  RegexFlags RVar2;
  
  aValue = JavascriptOperators::GetProperty
                     ((RecyclableObject *)this,propertyId,scriptContext,(PropertyValueInfo *)0x0);
  bVar1 = JavascriptConversion::ToBool(aValue,scriptContext);
  RVar2 = ~flag & flags;
  if (bVar1) {
    RVar2 = flag | flags;
  }
  return RVar2;
}

Assistant:

UnifiedRegex::RegexFlags JavascriptRegExp::SetRegexFlag(
        PropertyId propertyId,
        UnifiedRegex::RegexFlags flags,
        UnifiedRegex::RegexFlags flag,
        ScriptContext* scriptContext)
    {
        bool isEnabled = JavascriptConversion::ToBool(
            JavascriptOperators::GetProperty(this, propertyId, scriptContext),
            scriptContext);
        return isEnabled
            ? static_cast<UnifiedRegex::RegexFlags>(flags | flag)
            : static_cast<UnifiedRegex::RegexFlags>(flags & ~flag);
    }